

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O0

parser * init_parse_stores(void)

{
  parser *p_00;
  parser *p;
  
  p_00 = parser_new();
  z_info->store_max = 0;
  parser_setpriv(p_00,(void *)0x0);
  parser_reg(p_00,"store str name",parse_store);
  parser_reg(p_00,"town str name",parse_town);
  parser_reg(p_00,"owner uint purse sym race str name",parse_owner);
  parser_reg(p_00,"slots uint min uint max",parse_slots);
  parser_reg(p_00,"turnover uint turnover",parse_turnover);
  parser_reg(p_00,"normal sym tval sym sval",parse_normal);
  parser_reg(p_00,"always sym tval ?sym sval",parse_always);
  parser_reg(p_00,"buy str base",parse_buy);
  parser_reg(p_00,"buy-flag sym flag str base",parse_buy_flag);
  return p_00;
}

Assistant:

struct parser *init_parse_stores(void) {
	struct parser *p = parser_new();
	z_info->store_max = 0;
	parser_setpriv(p, NULL);
	parser_reg(p, "store str name", parse_store);
	parser_reg(p, "town str name", parse_town);
	parser_reg(p, "owner uint purse sym race str name", parse_owner);
	parser_reg(p, "slots uint min uint max", parse_slots);
	parser_reg(p, "turnover uint turnover", parse_turnover);
	parser_reg(p, "normal sym tval sym sval", parse_normal);
	parser_reg(p, "always sym tval ?sym sval", parse_always);
	parser_reg(p, "buy str base", parse_buy);
	parser_reg(p, "buy-flag sym flag str base", parse_buy_flag);
	return p;
}